

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Cpu.cpp
# Opt level: O1

void __thiscall Snes_Spc::cpu_write_high(Snes_Spc *this,int data,int i,rel_time_t time)

{
  if (i < 0x40) {
    (this->m).hi_ram[i] = (uint8_t)data;
    if ((this->m).rom_enabled != 0) {
      (this->m).ram.padding2[(long)i + -0x40] = (this->m).rom[i];
    }
    return;
  }
  (this->m).ram.padding2[(ulong)(uint)i - 0x40] = 0xff;
  cpu_write(this,data,i + -0x40,time);
  return;
}

Assistant:

void Snes_Spc::cpu_write_high( int data, int i, rel_time_t time )
{
	if ( i < rom_size )
	{
		m.hi_ram [i] = (uint8_t) data;
		if ( m.rom_enabled )
			RAM [i + rom_addr] = m.rom [i]; // restore overwritten ROM
	}
	else
	{
		assert( RAM [i + rom_addr] == (uint8_t) data );
		RAM [i + rom_addr] = cpu_pad_fill; // restore overwritten padding
		cpu_write( data, i + rom_addr - 0x10000, time );
	}
}